

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O0

uint LDSketch_find(LDSketch_t *tbl,uchar *key,int start_bit,int end_bit,int row_no)

{
  uint uVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int i;
  uint ret_bucket;
  char bit;
  uint oper;
  uchar key_str [50];
  int local_68;
  byte local_58 [60];
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  long local_8;
  
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_58,0,0x32);
  local_68 = local_14;
  while (local_68 <= local_18) {
    if ((local_18 - local_68) + 1 < 8) {
      local_58[local_68 / 8] =
           local_58[local_68 / 8] |
           (byte)((int)(((uint)*(byte *)(local_10 + local_68 / 8) &
                        1 << (8U - ((char)((long)local_68 % 8) + '\x01') & 0x1f)) != 0) <<
                 (8U - ((char)(local_68 % 8) + '\x01') & 0x1f));
      local_68 = local_68 + 1;
    }
    else {
      local_58[local_68 / 8] = *(byte *)(local_10 + local_68 / 8);
      local_68 = local_68 + 8;
    }
  }
  *(int *)(local_58 + *(int *)(local_8 + 0x14) / 8) =
       *(int *)(local_8 + 8) * *(int *)(local_8 + 0x20) + local_1c;
  uVar1 = LD_AwareHash1(local_58,*(int *)(local_8 + 0x14) / 8 + 4);
  return uVar1 % *(uint *)(local_8 + 0xc);
}

Assistant:

unsigned int LDSketch_find(LDSketch_t* tbl, const unsigned char* key,
	int start_bit, int end_bit, int row_no) {
	unsigned char key_str[50];  // assume n/8 + 4 <= 50
	unsigned int oper;
	char bit;
	unsigned int ret_bucket;

	int i;

	// set the key string
	memset(key_str, 0, sizeof(key_str));
	i = start_bit;  // start_bit == 0 in all cases
	while (i <= end_bit) {
		if (end_bit - i + 1 >= 8) {
			key_str[i / 8] = key[i / 8];
			i += 8;
		}
		else {
			bit = (key[i / 8] & (1 << (8 - ((i % 8) + 1)))) > 0 ? 1 : 0;
			key_str[i / 8] |= (bit << (8 - ((i % 8) + 1)));
			i++;
		}
	}

	// set the operator and add it to key string
	// oper = part_no * tbl->[part_no] + array_no;
	oper = tbl->h * tbl->tbl_id + row_no;
	// oper = row_no;
	memcpy(key_str + tbl->lgn / 8, &oper, sizeof(unsigned int));

	/*
	// hash
	MD5_CTX md5;
	unsigned char digest[16];
	MD5_Init(&md5);
	MD5_Update(&md5, key_str, tbl->n/8 + sizeof(unsigned int));
	MD5_Final(digest, &md5);
	memcpy(&ret_bucket, digest, sizeof(unsigned int));	// take 1st 4 bytes
	ret_bucket = (ret_bucket % tbl->K);
	*/

	ret_bucket =
		LD_AwareHash1(key_str, (unsigned int)(tbl->lgn / 8 + sizeof(unsigned int))) %
		(tbl->w);

	// return
	return ret_bucket;
}